

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O1

bool compare_files(char *pFilename1,char *pFilename2)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  FILE *__stream_00;
  ulong uVar3;
  ulong uVar4;
  void *__s;
  void *__s_00;
  size_t sVar5;
  char *pcVar6;
  value_type_conflict *__val_1;
  value_type_conflict *__val;
  bool bVar7;
  
  pcVar6 = pFilename2;
  __stream = (FILE *)open_file_with_retries(pFilename1,pFilename2);
  if (__stream == (FILE *)0x0) {
    print_error("Failed opening file: %s\n",pFilename1);
  }
  else {
    __stream_00 = (FILE *)open_file_with_retries(pFilename2,pcVar6);
    if (__stream_00 == (FILE *)0x0) {
      print_error("Failed opening file: %s\n",pFilename2);
    }
    else {
      fseek(__stream,0,2);
      uVar3 = ftello64(__stream);
      fseek(__stream,0,0);
      fseek(__stream_00,0,2);
      uVar4 = ftello64(__stream_00);
      fseek(__stream_00,0,0);
      if (uVar3 == uVar4) {
        __s = operator_new(0x100000);
        memset(__s,0,0x100000);
        __s_00 = operator_new(0x100000);
        memset(__s_00,0,0x100000);
        do {
          bVar7 = uVar3 == 0;
          if (bVar7) {
            fclose(__stream);
            fclose(__stream_00);
            break;
          }
          uVar4 = 0x100000;
          if ((long)uVar3 < 0x100000) {
            uVar4 = uVar3;
          }
          uVar4 = uVar4 & 0xffffffff;
          sVar5 = fread(__s,uVar4,1,__stream);
          pcVar6 = pFilename1;
          if ((sVar5 == 1) &&
             (sVar5 = fread(__s_00,uVar4,1,__stream_00), pcVar6 = pFilename2, sVar5 == 1)) {
            iVar2 = bcmp(__s,__s_00,uVar4);
            if (iVar2 != 0) {
              print_error("File data comparison failed!\n");
              goto LAB_00105f07;
            }
            uVar3 = uVar3 - uVar4;
            bVar1 = true;
          }
          else {
            print_error("Failed reading from file: %s\n",pcVar6);
LAB_00105f07:
            bVar1 = false;
            fclose(__stream);
            fclose(__stream_00);
          }
        } while (bVar1);
        operator_delete(__s_00,0x100000);
        operator_delete(__s,0x100000);
        return bVar7;
      }
      print_error("Files to compare are not the same size: %I64i vs. %I64i.\n",uVar3,uVar4);
      fclose(__stream);
      __stream = __stream_00;
    }
    fclose(__stream);
  }
  return false;
}

Assistant:

static bool compare_files(const char *pFilename1, const char* pFilename2)
{
   FILE* pFile1 = open_file_with_retries(pFilename1, "rb");
   if (!pFile1)
   {
      print_error("Failed opening file: %s\n", pFilename1);
      return false;
   }

   FILE* pFile2 = open_file_with_retries(pFilename2, "rb");
   if (!pFile2)
   {
      print_error("Failed opening file: %s\n", pFilename2);
      fclose(pFile1);
      return false;
   }

   fseek(pFile1, 0, SEEK_END);
   int64 fileSize1 = _ftelli64(pFile1);
   fseek(pFile1, 0, SEEK_SET);

   fseek(pFile2, 0, SEEK_END);
   int64 fileSize2 = _ftelli64(pFile2);
   fseek(pFile2, 0, SEEK_SET);

   if (fileSize1 != fileSize2)
   {
      print_error("Files to compare are not the same size: %I64i vs. %I64i.\n", fileSize1, fileSize2);
      fclose(pFile1);
      fclose(pFile2);
      return false;
   }

   const uint cBufSize = 1024 * 1024;
   std::vector<uint8> buf1(cBufSize);
   std::vector<uint8> buf2(cBufSize);

   int64 bytes_remaining = fileSize1;
   while (bytes_remaining)
   {
      const uint bytes_to_read = static_cast<uint>(my_min(cBufSize, bytes_remaining));

      if (fread(&buf1.front(), bytes_to_read, 1, pFile1) != 1)
      {
         print_error("Failed reading from file: %s\n", pFilename1);
         fclose(pFile1);
         fclose(pFile2);
         return false;
      }

      if (fread(&buf2.front(), bytes_to_read, 1, pFile2) != 1)
      {
         print_error("Failed reading from file: %s\n", pFilename2);
         fclose(pFile1);
         fclose(pFile2);
         return false;
      }

      if (memcmp(&buf1.front(), &buf2.front(), bytes_to_read) != 0)
      {
         print_error("File data comparison failed!\n");
         fclose(pFile1);
         fclose(pFile2);
         return false;
      }

      bytes_remaining -= bytes_to_read;
   }

   fclose(pFile1);
   fclose(pFile2);
   return true;
}